

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Visit.hpp
# Opt level: O0

void mserialize::detail::visit_sequence<binlog::ToStringVisitor,binlog::Range>
               (string_view full_tag,string_view tag,ToStringVisitor *visitor,Range *istream,
               int max_recursion)

{
  RepeatBegin RVar1;
  RepeatEnd re;
  string_view full_tag_00;
  SequenceBegin sb;
  string_view tag_00;
  string_view tag_01;
  string_view full_tag_01;
  string_view full_tag_02;
  bool bVar2;
  char *in_RCX;
  ToStringVisitor *in_RDX;
  char *in_RSI;
  size_t in_RDI;
  ToStringVisitor *in_R8;
  string_view sVar3;
  size_t unaff_retaddr;
  int in_stack_00000010;
  bool skip;
  string_view elem_tag;
  uint32_t size;
  undefined4 in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffeec;
  uint *in_stack_fffffffffffffef0;
  undefined4 in_stack_ffffffffffffff00;
  int in_stack_ffffffffffffff04;
  ToStringVisitor *in_stack_ffffffffffffff08;
  size_t in_stack_ffffffffffffff10;
  char *in_stack_ffffffffffffff18;
  size_t in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  size_t in_stack_ffffffffffffff30;
  undefined4 uStack_9c;
  ToStringVisitor *local_48;
  size_t local_40;
  uint local_34;
  
  string_view::remove_prefix((string_view *)&stack0xffffffffffffffe0,1);
  deserialize<unsigned_int,binlog::Range>
            (in_stack_fffffffffffffef0,
             (Range *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  sVar3 = tag_pop((string_view *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
  local_48 = (ToStringVisitor *)sVar3._ptr;
  local_40 = sVar3._len;
  sb.tag._ptr._0_4_ = in_stack_ffffffffffffff28;
  sb.size = in_stack_ffffffffffffff20;
  sb.tag._ptr._4_4_ = in_stack_ffffffffffffff2c;
  sb.tag._len = in_stack_ffffffffffffff30;
  bVar2 = binlog::ToStringVisitor::visit
                    (in_stack_ffffffffffffff08,sb,
                     (Range *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
  if (!bVar2) {
    if ((local_34 < 0x21) ||
       (full_tag_00._len = in_stack_ffffffffffffff20, full_tag_00._ptr = in_stack_ffffffffffffff18,
       sVar3._len = in_stack_ffffffffffffff10, sVar3._ptr = (char *)in_stack_ffffffffffffff08,
       bVar2 = singular(full_tag_00,sVar3,in_stack_ffffffffffffff04), !bVar2)) {
      while (local_34 != 0) {
        full_tag_02._len = unaff_retaddr;
        full_tag_02._ptr = in_RSI;
        tag_01._len = in_RDI;
        tag_01._ptr = in_RCX;
        visit_impl<binlog::ToStringVisitor,binlog::Range>
                  (full_tag_02,tag_01,in_RDX,(Range *)in_R8,in_stack_00000010);
        local_34 = local_34 - 1;
      }
    }
    else {
      RVar1._4_4_ = uStack_9c;
      RVar1.size = local_34;
      RVar1.tag._ptr = (char *)local_48;
      RVar1.tag._len = local_40;
      binlog::ToStringVisitor::visit(in_R8,RVar1);
      full_tag_01._len = unaff_retaddr;
      full_tag_01._ptr = in_RSI;
      tag_00._len = in_RDI;
      tag_00._ptr = in_RCX;
      visit_impl<binlog::ToStringVisitor,binlog::Range>
                (full_tag_01,tag_00,in_RDX,(Range *)in_R8,in_stack_00000010);
      re._4_4_ = in_stack_ffffffffffffff04;
      re.size = in_stack_ffffffffffffff00;
      re.tag._ptr = (char *)in_stack_ffffffffffffff08;
      re.tag._len = in_stack_ffffffffffffff10;
      binlog::ToStringVisitor::visit(local_48,re);
    }
    binlog::ToStringVisitor::visit(in_R8);
  }
  return;
}

Assistant:

void visit_sequence(const string_view full_tag, string_view tag, Visitor& visitor, InputStream& istream, int max_recursion)
{
  tag.remove_prefix(1); // drop [

  std::uint32_t size;
  mserialize::deserialize(size, istream);
  const string_view elem_tag = tag_pop(tag);

  const bool skip = visitor.visit(mserialize::Visitor::SequenceBegin{size, elem_tag}, istream);
  if (skip) { return; }

  if (size > 32 && singular(full_tag, elem_tag, max_recursion))
  {
    // every elem in the seq are the same and serialized using 0 bytes.
    // visit the first one only, to prevent little input generating huge output
    visitor.visit(mserialize::Visitor::RepeatBegin{size, elem_tag});
    visit_impl(full_tag, elem_tag, visitor, istream, max_recursion);
    visitor.visit(mserialize::Visitor::RepeatEnd{size, elem_tag});
  }
  else
  {
    while (size--)
    {
      visit_impl(full_tag, elem_tag, visitor, istream, max_recursion);
    }
  }

  visitor.visit(mserialize::Visitor::SequenceEnd{});
}